

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::~basic_cbor_encoder
          (basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
           *this)

{
  pointer psVar1;
  
  std::
  _Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->bytestringref_map_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->stringref_map_)._M_t);
  psVar1 = (this->stack_).
           super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->stack_).
                                 super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
    return;
  }
  return;
}

Assistant:

~basic_cbor_encoder() noexcept
    {
        JSONCONS_TRY
        {
            sink_.flush();
        }